

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O1

uint64_t __thiscall banksia::ChessBoard::xorHashKey(ChessBoard *this,int pos)

{
  PieceType PVar1;
  Side SVar2;
  pointer pPVar3;
  int iVar4;
  int iVar5;
  
  pPVar3 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_start;
  PVar1 = pPVar3[pos].type;
  SVar2 = pPVar3[pos].side;
  iVar4 = (*(this->super_BoardCore).super_Obj._vptr_Obj[8])(this,(ulong)(uint)pos);
  iVar5 = (*(this->super_BoardCore).super_Obj._vptr_Obj[9])(this,(ulong)(uint)pos);
  return RandomPiece[(int)(((SVar2 * 0x40 + iVar4) - (PVar1 * 0x80 + iVar5 * 8)) + 0x338)];
}

Assistant:

u64 ChessBoard::xorHashKey(int pos) const
{
    assert(isPositionValid(pos ));
    assert(!pieces[pos].isEmpty());
    
    auto sd = static_cast<int>(pieces[pos].side);
    auto kind_of_piece = (6 - static_cast<int>(pieces[pos].type)) * 2 + sd; assert(kind_of_piece >= 0 && kind_of_piece <= 11);
    
    auto file = getColumn(pos), row = 7 - getRow(pos);
    auto offset_piece = 64 * kind_of_piece + 8 * row + file;
    
    return RandomPiece[offset_piece];
}